

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  pointer *this_00;
  cmFileTimeCache *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ostream *poVar6;
  char *pcVar7;
  cmGlobalGenerator *__p;
  pointer pcVar8;
  undefined4 extraout_var;
  pointer pcVar9;
  char *pcVar10;
  reference pbVar11;
  string local_2938;
  undefined1 local_2918 [8];
  ostringstream msg_7;
  int local_279c;
  undefined1 local_2798 [4];
  int result_2;
  undefined1 local_2778 [8];
  ostringstream msg_6;
  int local_25fc;
  iterator iStack_25f8;
  int result_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_25f0;
  undefined1 local_25e8 [8];
  string out_oldest;
  iterator out;
  undefined1 local_25a0 [8];
  ostringstream msg_5;
  int local_2424;
  iterator iStack_2420;
  int result;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2418;
  undefined1 local_2410 [8];
  string dep_newest;
  iterator dep;
  undefined1 local_23c8 [8];
  ostringstream msg_4;
  allocator<char> local_2249;
  string local_2248;
  allocator<char> local_2221;
  string local_2220;
  allocator<char> local_21f9;
  string local_21f8;
  char *local_21d8;
  char *outputsStr;
  string local_21c8;
  char *local_21a8;
  char *dependsStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_2150 [8];
  ostringstream msg_3;
  string *p;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_1fb0;
  allocator<char> local_1f89;
  string local_1f88;
  char *local_1f68;
  char *productStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lgd;
  undefined1 local_1f28 [8];
  cmMakefile mfd;
  allocator<char> local_1721;
  string local_1720;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_1700;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> ggd;
  string local_16f0;
  char *local_16d0;
  char *genName;
  string local_16c0;
  undefined1 local_16a0 [8];
  ostringstream msg_2;
  cmStateSnapshot local_1528;
  undefined1 local_1510 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  undefined1 local_6b8 [8];
  cmake cm;
  ostringstream local_340 [8];
  ostringstream msg_1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream msg;
  bool verbose;
  cmake *this_local;
  
  bVar2 = isCMakeVerbose();
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar3 = cmsys::SystemTools::FileExists(&this->CheckBuildSystemArgument);
    if (bVar3) {
      cmake((cmake *)local_6b8,RoleScript,Unknown);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"",&local_6d9);
      SetHomeDirectory((cmake *)local_6b8,&local_6d8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::allocator<char>::~allocator(&local_6d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"",&local_701);
      SetHomeOutputDirectory((cmake *)local_6b8,&local_700);
      std::__cxx11::string::~string((string *)&local_700);
      std::allocator<char>::~allocator(&local_701);
      GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_6b8);
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
      cmGlobalGenerator::cmGlobalGenerator
                ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_6b8);
      GetCurrentSnapshot(&local_1528,(cmake *)local_6b8);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_1510,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,
                 &local_1528);
      bVar3 = cmMakefile::ReadListFile((cmMakefile *)local_1510,&this->CheckBuildSystemArgument);
      if ((!bVar3) || (bVar3 = cmSystemTools::GetErrorOccuredFlag(), bVar3)) {
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16a0);
          poVar6 = std::operator<<((ostream *)local_16a0,"Re-run cmake error reading : ");
          poVar6 = std::operator<<(poVar6,(string *)&this->CheckBuildSystemArgument);
          std::operator<<(poVar6,"\n");
          std::__cxx11::ostringstream::str();
          cmSystemTools::Stdout(&local_16c0);
          std::__cxx11::string::~string((string *)&local_16c0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16a0);
        }
        this_local._4_4_ = 1;
        genName._4_4_ = 1;
      }
      else {
        if ((this->ClearBuildSystem & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_16f0,"CMAKE_DEPENDS_GENERATOR",
                     (allocator<char> *)
                     ((long)&ggd._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
          pcVar7 = cmMakefile::GetDefinition((cmMakefile *)local_1510,&local_16f0);
          std::__cxx11::string::~string((string *)&local_16f0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&ggd._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
          if ((pcVar7 == (char *)0x0) || (local_16d0 = pcVar7, *pcVar7 == '\0')) {
            local_16d0 = "Unix Makefiles";
          }
          pcVar7 = local_16d0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1720,pcVar7,&local_1721);
          __p = CreateGlobalGenerator(this,&local_1720);
          std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
          unique_ptr<std::default_delete<cmGlobalGenerator>,void>
                    ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)
                     &local_1700,__p);
          std::__cxx11::string::~string((string *)&local_1720);
          std::allocator<char>::~allocator(&local_1721);
          bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_1700);
          if (bVar3) {
            GetCurrentSnapshot((cmStateSnapshot *)&mfd.IsSourceFileTryCompile,(cmake *)local_6b8);
            cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mfd.IsSourceFileTryCompile);
            pcVar8 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                     get(&local_1700);
            GetCurrentSnapshot((cmStateSnapshot *)&lgd,(cmake *)local_6b8);
            cmMakefile::cmMakefile((cmMakefile *)local_1f28,pcVar8,(cmStateSnapshot *)&lgd);
            pcVar8 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                     operator->(&local_1700);
            iVar4 = (*pcVar8->_vptr_cmGlobalGenerator[2])(pcVar8,local_1f28);
            this_00 = &products.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>::
            unique_ptr<std::default_delete<cmLocalGenerator>,void>
                      ((unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>> *)this_00
                       ,(pointer)CONCAT44(extraout_var,iVar4));
            pcVar9 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                     operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                 *)this_00);
            (*pcVar9->_vptr_cmLocalGenerator[10])(pcVar9,local_1f28,(ulong)bVar2);
            std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::~unique_ptr
                      ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                       &products.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmMakefile::~cmMakefile((cmMakefile *)local_1f28);
          }
          std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                    (&local_1700);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&productStr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f88,"CMAKE_MAKEFILE_PRODUCTS",&local_1f89);
        pcVar7 = cmMakefile::GetDefinition((cmMakefile *)local_1510,&local_1f88);
        std::__cxx11::string::~string((string *)&local_1f88);
        std::allocator<char>::~allocator(&local_1f89);
        local_1f68 = pcVar7;
        if (pcVar7 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1fb0,pcVar7,(allocator<char> *)((long)&__range1 + 7));
          cmSystemTools::ExpandListArgument
                    (&local_1fb0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&productStr,false);
          std::__cxx11::string::~string((string *)&local_1fb0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        }
        __end1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&productStr);
        p = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&productStr);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&p), bVar3) {
          pbVar11 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
          bVar3 = cmsys::SystemTools::FileExists(pbVar11);
          if ((!bVar3) && (bVar3 = cmsys::SystemTools::FileIsSymlink(pbVar11), !bVar3)) {
            if (bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2150);
              poVar6 = std::operator<<((ostream *)local_2150,"Re-run cmake, missing byproduct: ");
              poVar6 = std::operator<<(poVar6,(string *)pbVar11);
              std::operator<<(poVar6,"\n");
              std::__cxx11::ostringstream::str();
              cmSystemTools::Stdout
                        ((string *)
                         &depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string
                        ((string *)
                         &depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2150);
            }
            this_local._4_4_ = 1;
            genName._4_4_ = 1;
            goto LAB_00282137;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&outputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dependsStr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_21c8,"CMAKE_MAKEFILE_DEPENDS",
                   (allocator<char> *)((long)&outputsStr + 7));
        pcVar7 = cmMakefile::GetDefinition((cmMakefile *)local_1510,&local_21c8);
        std::__cxx11::string::~string((string *)&local_21c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&outputsStr + 7));
        local_21a8 = pcVar7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_21f8,"CMAKE_MAKEFILE_OUTPUTS",&local_21f9);
        pcVar10 = cmMakefile::GetDefinition((cmMakefile *)local_1510,&local_21f8);
        std::__cxx11::string::~string((string *)&local_21f8);
        std::allocator<char>::~allocator(&local_21f9);
        pcVar7 = local_21a8;
        local_21d8 = pcVar10;
        if ((local_21a8 != (char *)0x0) && (pcVar10 != (char *)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2220,pcVar7,&local_2221);
          cmSystemTools::ExpandListArgument
                    (&local_2220,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&outputs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
          std::__cxx11::string::~string((string *)&local_2220);
          std::allocator<char>::~allocator(&local_2221);
          pcVar7 = local_21d8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2248,pcVar7,&local_2249);
          cmSystemTools::ExpandListArgument
                    (&local_2248,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dependsStr,false);
          std::__cxx11::string::~string((string *)&local_2248);
          std::allocator<char>::~allocator(&local_2249);
        }
        bVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&outputs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((bVar3) ||
           (bVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&dependsStr), bVar3)) {
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_23c8);
            std::operator<<((ostream *)local_23c8,
                            "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Stdout((string *)&dep);
            std::__cxx11::string::~string((string *)&dep);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_23c8);
          }
          this_local._4_4_ = 1;
          genName._4_4_ = 1;
        }
        else {
          dep_newest.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_2418 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&dep_newest.field_2 + 8),0);
          pbVar11 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_2418);
          std::__cxx11::string::string((string *)local_2410,(string *)pbVar11);
          while( true ) {
            iStack_2420 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&outputs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&dep_newest.field_2 + 8),&stack0xffffffffffffdbe0);
            if (!bVar3) break;
            local_2424 = 0;
            pcVar1 = this->FileTimeCache;
            pbVar11 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)((long)&dep_newest.field_2 + 8));
            bVar3 = cmFileTimeCache::Compare(pcVar1,(string *)local_2410,pbVar11,&local_2424);
            if (!bVar3) {
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_25a0);
                std::operator<<((ostream *)local_25a0,
                                "Re-run cmake: build system dependency is missing\n");
                std::__cxx11::ostringstream::str();
                cmSystemTools::Stdout((string *)&out);
                std::__cxx11::string::~string((string *)&out);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_25a0);
              }
              this_local._4_4_ = 1;
              genName._4_4_ = 1;
              goto LAB_002820e7;
            }
            if (local_2424 < 0) {
              pbVar11 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&dep_newest.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_2410,(string *)pbVar11);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&dep_newest.field_2 + 8));
          }
          out_oldest.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&dependsStr);
          local_25f0 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&out_oldest.field_2 + 8),0);
          pbVar11 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_25f0);
          std::__cxx11::string::string((string *)local_25e8,(string *)pbVar11);
          while( true ) {
            iStack_25f8 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&dependsStr);
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&out_oldest.field_2 + 8),&stack0xffffffffffffda08);
            if (!bVar3) break;
            local_25fc = 0;
            pcVar1 = this->FileTimeCache;
            pbVar11 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)((long)&out_oldest.field_2 + 8));
            bVar3 = cmFileTimeCache::Compare(pcVar1,(string *)local_25e8,pbVar11,&local_25fc);
            if (!bVar3) {
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2778);
                std::operator<<((ostream *)local_2778,
                                "Re-run cmake: build system output is missing\n");
                std::__cxx11::ostringstream::str();
                cmSystemTools::Stdout((string *)local_2798);
                std::__cxx11::string::~string((string *)local_2798);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2778);
              }
              this_local._4_4_ = 1;
              goto LAB_002820cb;
            }
            if (0 < local_25fc) {
              pbVar11 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&out_oldest.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_25e8,(string *)pbVar11);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&out_oldest.field_2 + 8));
          }
          local_279c = 0;
          bVar3 = cmFileTimeCache::Compare
                            (this->FileTimeCache,(string *)local_25e8,(string *)local_2410,
                             &local_279c);
          if ((bVar3) && (-1 < local_279c)) {
            this_local._4_4_ = 0;
          }
          else {
            if (bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2918);
              poVar6 = std::operator<<((ostream *)local_2918,"Re-run cmake file: ");
              poVar6 = std::operator<<(poVar6,(string *)local_25e8);
              poVar6 = std::operator<<(poVar6," older than: ");
              poVar6 = std::operator<<(poVar6,(string *)local_2410);
              std::operator<<(poVar6,"\n");
              std::__cxx11::ostringstream::str();
              cmSystemTools::Stdout(&local_2938);
              std::__cxx11::string::~string((string *)&local_2938);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2918);
            }
            this_local._4_4_ = 1;
          }
LAB_002820cb:
          genName._4_4_ = 1;
          std::__cxx11::string::~string((string *)local_25e8);
LAB_002820e7:
          std::__cxx11::string::~string((string *)local_2410);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dependsStr);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&outputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00282137:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&productStr);
      }
      cmMakefile::~cmMakefile((cmMakefile *)local_1510);
      cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
      ~cmake((cmake *)local_6b8);
    }
    else {
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_340);
        poVar6 = std::operator<<((ostream *)local_340,"Re-run cmake missing file: ");
        poVar6 = std::operator<<(poVar6,(string *)&this->CheckBuildSystemArgument);
        std::operator<<(poVar6,"\n");
        std::__cxx11::ostringstream::str();
        cmSystemTools::Stdout
                  ((string *)
                   &cm.TraceOnlyThisSources.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &cm.TraceOnlyThisSources.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::ostringstream::~ostringstream(local_340);
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::operator<<((ostream *)local_198,"Re-run cmake no build system arguments\n");
      std::__cxx11::ostringstream::str();
      cmSystemTools::Stdout(&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.
  const bool verbose = isCMakeVerbose();

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if (this->CheckBuildSystemArgument.empty()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // If the file provided does not exist, we have to rerun.
  if (!cmSystemTools::FileExists(this->CheckBuildSystemArgument)) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: " << this->CheckBuildSystemArgument
          << "\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  // Actually, all we need is the `set` command.
  cmake cm(RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!mf.ReadListFile(this->CheckBuildSystemArgument) ||
      cmSystemTools::GetErrorOccuredFlag()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : " << this->CheckBuildSystemArgument
          << "\n";
      cmSystemTools::Stdout(msg.str());
    }
    // There was an error reading the file.  Just rerun.
    return 1;
  }

  if (this->ClearBuildSystem) {
    // Get the generator used for this build system.
    const char* genName = mf.GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if (!genName || genName[0] == '\0') {
      genName = "Unix Makefiles";
    }

    // Create the generator and use it to clear the dependencies.
    std::unique_ptr<cmGlobalGenerator> ggd(
      this->CreateGlobalGenerator(genName));
    if (ggd) {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmMakefile mfd(ggd.get(), cm.GetCurrentSnapshot());
      std::unique_ptr<cmLocalGenerator> lgd(ggd->CreateLocalGenerator(&mfd));
      lgd->ClearDependencies(&mfd, verbose);
    }
  }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if (const char* productStr = mf.GetDefinition("CMAKE_MAKEFILE_PRODUCTS")) {
    cmSystemTools::ExpandListArgument(productStr, products);
  }
  for (std::string const& p : products) {
    if (!(cmSystemTools::FileExists(p) || cmSystemTools::FileIsSymlink(p))) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << p << "\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf.GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf.GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if (dependsStr && outputsStr) {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
  }
  if (depends.empty() || outputs.empty()) {
    // Not enough information was provided to do the test.  Just rerun.
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
             "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for (; dep != depends.end(); ++dep) {
    int result = 0;
    if (this->FileTimeCache->Compare(dep_newest, *dep, &result)) {
      if (result < 0) {
        dep_newest = *dep;
      }
    } else {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for (; out != outputs.end(); ++out) {
    int result = 0;
    if (this->FileTimeCache->Compare(out_oldest, *out, &result)) {
      if (result > 0) {
        out_oldest = *out;
      }
    } else {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // If any output is older than any dependency then rerun.
  {
    int result = 0;
    if (!this->FileTimeCache->Compare(out_oldest, dep_newest, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake file: " << out_oldest
            << " older than: " << dep_newest << "\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // No need to rerun.
  return 0;
}